

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkpp.cpp
# Opt level: O0

bool __thiscall
pg::ZLKPPSolver::do_step
          (ZLKPPSolver *this,int max_priority,int prec_cur,int prec_opo,int *num_nodes_in_h,
          bool *reached_bottom_cur,bool *reached_bottom_opo)

{
  pointer *nodes;
  vector<int,_std::allocator<int>_> local_c8;
  byte local_a9;
  undefined1 local_a8 [7];
  bool changed;
  undefined1 local_90 [8];
  vector<int,_std::allocator<int>_> lose;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> top;
  bool *reached_bottom_cur_local;
  int *num_nodes_in_h_local;
  int prec_opo_local;
  int prec_cur_local;
  int max_priority_local;
  ZLKPPSolver *this_local;
  
  *num_nodes_in_h = 0x7fffffff;
  if (this->cur_num_nodes == 0) {
    this_local._7_1_ = false;
  }
  else if (prec_opo < this->min_dominion) {
    *reached_bottom_opo = true;
    this_local._7_1_ = false;
  }
  else {
    this->iterations = this->iterations + 1;
    top.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)reached_bottom_cur;
    if (this->cur_num_nodes == 0) {
      __assert_fail("cur_num_nodes",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/zlkpp.cpp"
                    ,0x95,"bool pg::ZLKPPSolver::do_step(int, int, int, int &, bool &, bool &)");
    }
    get_nodes_of_max_priority((vector<int,_std::allocator<int>_> *)local_50,this,max_priority);
    get_attractor(this,max_priority % 2,(vector<int,_std::allocator<int>_> *)local_50);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &lose.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_50);
    nodes = &lose.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    remove_nodes(this,(vector<int,_std::allocator<int>_> *)nodes);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)nodes);
    solve((vector<int,_std::allocator<int>_> *)local_90,this,max_priority + -1,prec_opo,prec_cur,
          reached_bottom_opo,
          (bool *)top.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
    *num_nodes_in_h = this->cur_num_nodes;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_a8,
               (vector<int,_std::allocator<int>_> *)local_50);
    restore_nodes(this,(vector<int,_std::allocator<int>_> *)local_a8);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a8);
    local_a9 = get_attractor(this,(max_priority + -1) -
                                  ((max_priority + -1) - (max_priority + -1 >> 0x1f) & 0xfffffffeU),
                             (vector<int,_std::allocator<int>_> *)local_90);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_c8,(vector<int,_std::allocator<int>_> *)local_90);
    remove_nodes(this,&local_c8);
    std::vector<int,_std::allocator<int>_>::~vector(&local_c8);
    this_local._7_1_ = (bool)(local_a9 & 1);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_90);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  }
  return this_local._7_1_;
}

Assistant:

bool ZLKPPSolver::do_step(int max_priority, int prec_cur, int prec_opo, int &num_nodes_in_h, bool &reached_bottom_cur, bool &reached_bottom_opo) {
    num_nodes_in_h = INT_MAX;
    if (!cur_num_nodes)
        return false;
    if (prec_opo < min_dominion) {
        reached_bottom_opo = true;
        return false;
    }
    ++iterations;
    assert(cur_num_nodes); // we assume that the current game is nonempty
    auto top = get_nodes_of_max_priority(max_priority);
    get_attractor(max_priority % 2, top);
    remove_nodes(top);
    auto lose = solve(max_priority - 1, prec_opo, prec_cur, reached_bottom_opo, reached_bottom_cur);
    num_nodes_in_h = cur_num_nodes;
    restore_nodes(top);
    bool changed = get_attractor((max_priority - 1) % 2, lose);
    remove_nodes(lose);
    return changed;
}